

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

void __thiscall
duckdb::ExtensionOption::ExtensionOption
          (ExtensionOption *this,string *description_p,LogicalType *type_p,
          set_option_callback_t set_function_p,Value *default_value_p)

{
  ::std::__cxx11::string::string((string *)this,(string *)description_p);
  LogicalType::LogicalType(&this->type,type_p);
  this->set_function = set_function_p;
  Value::Value(&this->default_value,default_value_p);
  return;
}

Assistant:

ExtensionOption(string description_p, LogicalType type_p, set_option_callback_t set_function_p,
	                Value default_value_p)
	    : description(std::move(description_p)), type(std::move(type_p)), set_function(set_function_p),
	      default_value(std::move(default_value_p)) {
	}